

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExact.c
# Opt level: O3

DdHalfWord ** getMatrix(int rows,int cols)

{
  DdHalfWord **__ptr;
  DdHalfWord *pDVar1;
  ulong uVar2;
  
  if ((cols * rows != 0) &&
     (__ptr = (DdHalfWord **)malloc((long)rows << 3), __ptr != (DdHalfWord **)0x0)) {
    pDVar1 = (DdHalfWord *)malloc((long)(cols * rows) << 2);
    *__ptr = pDVar1;
    if (pDVar1 != (DdHalfWord *)0x0) {
      if (rows < 2) {
        return __ptr;
      }
      pDVar1 = *__ptr;
      uVar2 = 1;
      do {
        pDVar1 = pDVar1 + cols;
        __ptr[uVar2] = pDVar1;
        uVar2 = uVar2 + 1;
      } while ((uint)rows != uVar2);
      return __ptr;
    }
    free(__ptr);
  }
  return (DdHalfWord **)0x0;
}

Assistant:

static DdHalfWord **
getMatrix(
  int  rows /* number of rows */,
  int  cols /* number of columns */)
{
    DdHalfWord **matrix;
    int i;

    if (cols*rows == 0) return(NULL);
    matrix = ABC_ALLOC(DdHalfWord *, rows);
    if (matrix == NULL) return(NULL);
    matrix[0] = ABC_ALLOC(DdHalfWord, cols*rows);
    if (matrix[0] == NULL) {
        ABC_FREE(matrix);
        return(NULL);
    }
    for (i = 1; i < rows; i++) {
        matrix[i] = matrix[i-1] + cols;
    }
    return(matrix);

}